

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  uint32 uVar5;
  Type TVar6;
  int value_16;
  undefined4 extraout_var;
  Descriptor *this;
  MessageOptions *this_00;
  ulong uVar8;
  FieldOptions *this_01;
  uint64 uVar9;
  char *data;
  string *local_2f0;
  string *local_2c8;
  EnumValueDescriptor *local_2b0;
  MessageLite *local_2a8;
  MessageLite *local_298;
  byte local_289;
  double local_280;
  float local_26c;
  uint64 local_268;
  uint32 local_25c;
  uint64 local_258;
  uint32 local_24c;
  uint64 local_248;
  uint32 local_23c;
  int64 local_230;
  int32 local_21c;
  uint64 local_218;
  int32 local_20c;
  string *value_15;
  string scratch_1;
  string *value_14;
  string scratch;
  EnumValueDescriptor *value_13;
  bool value_12;
  double value_11;
  float value_10;
  int64 value_9;
  int32 value_8;
  uint64 value_7;
  uint32 value_6;
  uint64 value_5;
  uint32 value_4;
  int64 value_3;
  int32 value_2;
  int64 value_1;
  int local_128;
  int32 value;
  int j;
  int data_size;
  bool is_packed;
  int count;
  Reflection *message_reflection;
  CodedOutputStream *output_local;
  Message *message_local;
  FieldDescriptor *field_local;
  long *plVar7;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar7 = (long *)CONCAT44(extraout_var,iVar3);
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this = FieldDescriptor::containing_type(field);
    this_00 = Descriptor::options(this);
    bVar1 = MessageOptions::message_set_wire_format(this_00);
    if (((bVar1) && (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_MESSAGE)) &&
       (bVar1 = FieldDescriptor::is_repeated(field), !bVar1)) {
      SerializeMessageSetItemWithCachedSizes(field,message,output);
      return;
    }
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    data_size = (**(code **)(*plVar7 + 0x30))(plVar7,message,field);
  }
  else {
    uVar8 = (**(code **)(*plVar7 + 0x28))(plVar7,message,field);
    data_size = (int)((uVar8 & 1) != 0);
  }
  this_01 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::packed(this_01);
  if ((bVar1) && (0 < data_size)) {
    iVar3 = FieldDescriptor::number(field);
    uVar5 = WireFormatLite::MakeTag(iVar3,WIRETYPE_LENGTH_DELIMITED);
    io::CodedOutputStream::WriteTag(output,uVar5);
    uVar5 = FieldDataOnlyByteSize(field,message);
    io::CodedOutputStream::WriteVarint32(output,uVar5);
  }
  for (local_128 = 0; local_128 < data_size; local_128 = local_128 + 1) {
    TVar6 = FieldDescriptor::type(field);
    switch(TVar6) {
    case TYPE_DOUBLE:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_280 = (double)(**(code **)(*plVar7 + 0x140))(plVar7,message,field,local_128);
      }
      else {
        local_280 = (double)(**(code **)(*plVar7 + 0x90))(plVar7,message,field);
      }
      if (bVar1) {
        uVar9 = WireFormatLite::EncodeDouble(local_280);
        io::CodedOutputStream::WriteLittleEndian64(output,uVar9);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteDouble(iVar3,local_280,output);
      }
      break;
    case TYPE_FLOAT:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_26c = (float)(**(code **)(*plVar7 + 0x138))(plVar7,message,field,local_128);
      }
      else {
        local_26c = (float)(**(code **)(*plVar7 + 0x88))(plVar7,message,field);
      }
      if (bVar1) {
        uVar5 = WireFormatLite::EncodeFloat(local_26c);
        io::CodedOutputStream::WriteLittleEndian32(output,uVar5);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFloat(iVar3,local_26c,output);
      }
      break;
    case TYPE_INT64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_218 = (**(code **)(*plVar7 + 0x120))(plVar7,message,field,local_128);
      }
      else {
        local_218 = (**(code **)(*plVar7 + 0x70))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint64(output,local_218);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteInt64(iVar3,local_218,output);
      }
      break;
    case TYPE_UINT64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_248 = (**(code **)(*plVar7 + 0x130))(plVar7,message,field,local_128);
      }
      else {
        local_248 = (**(code **)(*plVar7 + 0x80))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint64(output,local_248);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteUInt64(iVar3,local_248,output);
      }
      break;
    case TYPE_INT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_20c = (**(code **)(*plVar7 + 0x118))(plVar7,message,field,local_128);
      }
      else {
        local_20c = (**(code **)(*plVar7 + 0x68))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32SignExtended(output,local_20c);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteInt32(iVar3,local_20c,output);
      }
      break;
    case TYPE_FIXED64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_258 = (**(code **)(*plVar7 + 0x130))(plVar7,message,field,local_128);
      }
      else {
        local_258 = (**(code **)(*plVar7 + 0x80))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian64(output,local_258);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFixed64(iVar3,local_258,output);
      }
      break;
    case TYPE_FIXED32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_24c = (**(code **)(*plVar7 + 0x128))(plVar7,message,field,local_128);
      }
      else {
        local_24c = (**(code **)(*plVar7 + 0x78))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian32(output,local_24c);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFixed32(iVar3,local_24c,output);
      }
      break;
    case TYPE_BOOL:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_289 = (**(code **)(*plVar7 + 0x148))(plVar7,message,field,local_128);
      }
      else {
        local_289 = (**(code **)(*plVar7 + 0x98))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32(output,(uint)((bool)(local_289 & 1) != false));
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteBool(iVar3,(bool)(local_289 & 1),output);
      }
      break;
    case TYPE_STRING:
      std::__cxx11::string::string((string *)&value_14);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2c8 = (string *)
                    (**(code **)(*plVar7 + 0x168))(plVar7,message,field,local_128,&value_14);
      }
      else {
        local_2c8 = (string *)(**(code **)(*plVar7 + 0xb8))(plVar7,message,field,&value_14);
      }
      data = (char *)std::__cxx11::string::data();
      iVar3 = std::__cxx11::string::length();
      VerifyUTF8String(data,iVar3,SERIALIZE);
      iVar3 = FieldDescriptor::number(field);
      WireFormatLite::WriteString(iVar3,local_2c8,output);
      std::__cxx11::string::~string((string *)&value_14);
      break;
    case TYPE_GROUP:
      iVar3 = FieldDescriptor::number(field);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_298 = (MessageLite *)(**(code **)(*plVar7 + 0x160))(plVar7,message,field,local_128);
      }
      else {
        local_298 = (MessageLite *)(**(code **)(*plVar7 + 0xb0))(plVar7,message,field,0);
      }
      WireFormatLite::WriteGroup(iVar3,local_298,output);
      break;
    case TYPE_MESSAGE:
      iVar3 = FieldDescriptor::number(field);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2a8 = (MessageLite *)(**(code **)(*plVar7 + 0x160))(plVar7,message,field,local_128);
      }
      else {
        local_2a8 = (MessageLite *)(**(code **)(*plVar7 + 0xb0))(plVar7,message,field,0);
      }
      WireFormatLite::WriteMessage(iVar3,local_2a8,output);
      break;
    case TYPE_BYTES:
      std::__cxx11::string::string((string *)&value_15);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2f0 = (string *)
                    (**(code **)(*plVar7 + 0x168))(plVar7,message,field,local_128,&value_15);
      }
      else {
        local_2f0 = (string *)(**(code **)(*plVar7 + 0xb8))(plVar7,message,field,&value_15);
      }
      iVar3 = FieldDescriptor::number(field);
      WireFormatLite::WriteBytes(iVar3,local_2f0,output);
      std::__cxx11::string::~string((string *)&value_15);
      break;
    case TYPE_UINT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_23c = (**(code **)(*plVar7 + 0x128))(plVar7,message,field,local_128);
      }
      else {
        local_23c = (**(code **)(*plVar7 + 0x78))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32(output,local_23c);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteUInt32(iVar3,local_23c,output);
      }
      break;
    case TYPE_ENUM:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2b0 = (EnumValueDescriptor *)
                    (**(code **)(*plVar7 + 0x158))(plVar7,message,field,local_128);
      }
      else {
        local_2b0 = (EnumValueDescriptor *)(**(code **)(*plVar7 + 0xa8))(plVar7,message,field);
      }
      scratch.field_2._8_8_ = local_2b0;
      if (bVar1) {
        iVar3 = EnumValueDescriptor::number(local_2b0);
        io::CodedOutputStream::WriteVarint32SignExtended(output,iVar3);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        value_16 = EnumValueDescriptor::number((EnumValueDescriptor *)scratch.field_2._8_8_);
        WireFormatLite::WriteEnum(iVar3,value_16,output);
      }
      break;
    case TYPE_SFIXED32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_25c = (**(code **)(*plVar7 + 0x118))(plVar7,message,field,local_128);
      }
      else {
        local_25c = (**(code **)(*plVar7 + 0x68))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian32(output,local_25c);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSFixed32(iVar3,local_25c,output);
      }
      break;
    case TYPE_SFIXED64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_268 = (**(code **)(*plVar7 + 0x120))(plVar7,message,field,local_128);
      }
      else {
        local_268 = (**(code **)(*plVar7 + 0x70))(plVar7,message,field);
      }
      if (bVar1) {
        io::CodedOutputStream::WriteLittleEndian64(output,local_268);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSFixed64(iVar3,local_268,output);
      }
      break;
    case TYPE_SINT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_21c = (**(code **)(*plVar7 + 0x118))(plVar7,message,field,local_128);
      }
      else {
        local_21c = (**(code **)(*plVar7 + 0x68))(plVar7,message,field);
      }
      if (bVar1) {
        uVar5 = WireFormatLite::ZigZagEncode32(local_21c);
        io::CodedOutputStream::WriteVarint32(output,uVar5);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSInt32(iVar3,local_21c,output);
      }
      break;
    case MAX_TYPE:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_230 = (**(code **)(*plVar7 + 0x120))(plVar7,message,field,local_128);
      }
      else {
        local_230 = (**(code **)(*plVar7 + 0x70))(plVar7,message,field);
      }
      if (bVar1) {
        uVar9 = WireFormatLite::ZigZagEncode64(local_230);
        io::CodedOutputStream::WriteVarint64(output,uVar9);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSInt64(iVar3,local_230,output);
      }
    }
  }
  return;
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const bool is_packed = field->options().packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const int data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                       \
      case FieldDescriptor::TYPE_##TYPE:                                     \
        WireFormatLite::Write##TYPE_METHOD(                                  \
              field->number(),                                               \
              field->is_repeated() ?                                         \
                message_reflection->GetRepeated##CPPTYPE_METHOD(             \
                  message, field, j) :                                       \
                message_reflection->Get##CPPTYPE_METHOD(message, field),     \
              output);                                                       \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        VerifyUTF8String(value.data(), value.length(), SERIALIZE);
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}